

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_cc79b7::Target::Target(Target *this,cmGeneratorTarget *gt,string *config)

{
  cmGlobalGenerator *pcVar1;
  cmake *pcVar2;
  string *psVar3;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__x;
  string local_50;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *gt_local;
  Target *this_local;
  
  this->GT = gt;
  this->Config = config;
  local_20 = config;
  config_local = (string *)gt;
  gt_local = (cmGeneratorTarget *)this;
  pcVar1 = cmGeneratorTarget::GetGlobalGenerator(gt);
  pcVar2 = cmGlobalGenerator::GetCMakeInstance(pcVar1);
  psVar3 = cmake::GetHomeDirectory_abi_cxx11_(pcVar2);
  std::__cxx11::string::string((string *)&this->TopSource,(string *)psVar3);
  pcVar1 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)config_local);
  pcVar2 = cmGlobalGenerator::GetCMakeInstance(pcVar1);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar2);
  std::__cxx11::string::string((string *)&this->TopBuild,(string *)psVar3);
  __x = cmMakefile::GetSourceGroups(this->GT->Makefile);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&this->SourceGroupsLocal,__x);
  std::__cxx11::string::string((string *)&local_50,(string *)&this->TopSource);
  BacktraceData::BacktraceData(&this->Backtraces,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
  ::map(&this->CompileDataMap);
  std::
  unordered_map<const_cmSourceFile_*,_unsigned_int,_std::hash<const_cmSourceFile_*>,_std::equal_to<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_int>_>_>
  ::unordered_map(&this->SourceMap);
  Json::Value::Value(&this->Sources,arrayValue);
  std::
  unordered_map<const_cmSourceGroup_*,_unsigned_int,_std::hash<const_cmSourceGroup_*>,_std::equal_to<const_cmSourceGroup_*>,_std::allocator<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>_>
  ::unordered_map(&this->SourceGroupsMap);
  std::
  vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
  ::vector(&this->SourceGroups);
  std::
  unordered_map<(anonymous_namespace)::CompileData,_unsigned_int,_std::hash<(anonymous_namespace)::CompileData>,_std::equal_to<(anonymous_namespace)::CompileData>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>_>
  ::unordered_map(&this->CompileGroupMap);
  std::
  vector<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
  ::vector(&this->CompileGroups);
  return;
}

Assistant:

Target::Target(cmGeneratorTarget* gt, std::string const& config)
  : GT(gt)
  , Config(config)
  , TopSource(gt->GetGlobalGenerator()->GetCMakeInstance()->GetHomeDirectory())
  , TopBuild(
      gt->GetGlobalGenerator()->GetCMakeInstance()->GetHomeOutputDirectory())
  , SourceGroupsLocal(this->GT->Makefile->GetSourceGroups())
  , Backtraces(this->TopSource)
{
}